

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.hpp
# Opt level: O3

Iterator __thiscall List<String>::removeBack(List<String> *this)

{
  Item *this_00;
  Item *pIVar1;
  Item *pIVar2;
  Iterator *pIVar3;
  Item *item;
  
  this_00 = ((this->_end).item)->prev;
  pIVar1 = this_00->prev;
  pIVar2 = this_00->next;
  pIVar3 = (Iterator *)&pIVar1->next;
  if (pIVar1 == (Item *)0x0) {
    pIVar3 = &this->_begin;
  }
  pIVar3->item = pIVar2;
  pIVar2->prev = pIVar1;
  this->_size = this->_size - 1;
  String::~String(&this_00->value);
  this_00->prev = this->freeItem;
  this->freeItem = this_00;
  return (Iterator)this_00->next;
}

Assistant:

Iterator removeBack() {return remove(Iterator(_end.item->prev));}